

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O2

shared_ptr<duckdb::Relation,_true> __thiscall
duckdb::Relation::TableFunction
          (Relation *this,string *fname,vector<duckdb::Value,_true> *values,
          named_parameter_map_t *named_parameters)

{
  undefined8 uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::Relation,_true> *in_R8;
  shared_ptr<duckdb::Relation,_true> sVar2;
  enable_shared_from_this<duckdb::Relation> eStack_58;
  undefined1 local_48 [32];
  
  shared_ptr<duckdb::ClientContextWrapper,_true>::operator->
            ((shared_ptr<duckdb::ClientContextWrapper,_true> *)((long)&fname->field_2 + 8));
  ClientContextWrapper::GetContext((ClientContextWrapper *)local_48);
  enable_shared_from_this<duckdb::Relation>::shared_from_this(&eStack_58);
  make_shared_ptr<duckdb::TableFunctionRelation,duckdb::shared_ptr<duckdb::ClientContext,true>,std::__cxx11::string_const&,duckdb::vector<duckdb::Value,true>const&,std::unordered_map<std::__cxx11::string,duckdb::Value,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>const&,duckdb::shared_ptr<duckdb::Relation,true>>
            ((shared_ptr<duckdb::ClientContext,_true> *)(local_48 + 0x10),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,values,
             named_parameters,in_R8);
  uVar1 = local_48._24_8_;
  local_48._24_8_ = 0;
  this->_vptr_Relation = (_func_int **)local_48._16_8_;
  (this->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
  super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)uVar1;
  local_48._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 0x18));
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &eStack_58.__weak_this_.internal.
              super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<duckdb::Relation,_true>)
         sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Relation> Relation::TableFunction(const std::string &fname, const vector<Value> &values,
                                             const named_parameter_map_t &named_parameters) {
	return make_shared_ptr<TableFunctionRelation>(context->GetContext(), fname, values, named_parameters,
	                                              shared_from_this());
}